

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyShow.c
# Opt level: O1

void Ivy_ManShow(Ivy_Man_t *pMan,int fHaig,Vec_Ptr_t *vBold)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  FILE *pFVar7;
  long lVar8;
  char *pcVar9;
  Vec_Ptr_t *pVVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  char FileNameDot [200];
  
  Ivy_ManShow::Counter = Ivy_ManShow::Counter + 1;
  sprintf(FileNameDot,"temp%02d.dot");
  pFVar7 = fopen(FileNameDot,"w");
  if (pFVar7 == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
  }
  else {
    fclose(pFVar7);
    if (pMan->nObjs[6] + pMan->nObjs[5] < 0xc9) {
      pFVar7 = fopen(FileNameDot,"w");
      if (pFVar7 == (FILE *)0x0) {
        fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
      }
      else {
        if ((vBold != (Vec_Ptr_t *)0x0) && (0 < vBold->nSize)) {
          lVar8 = 0;
          do {
            puVar1 = (uint *)((long)vBold->pArray[lVar8] + 8);
            *puVar1 = *puVar1 | 0x20;
            lVar8 = lVar8 + 1;
          } while (lVar8 < vBold->nSize);
        }
        uVar5 = Ivy_ManSetLevels(pMan,fHaig);
        uVar6 = uVar5 + 1;
        fprintf(pFVar7,"# %s\n","AIG structure generated by IVY package");
        fputc(10,pFVar7);
        fwrite("digraph AIG {\n",0xe,1,pFVar7);
        fwrite("size = \"7.5,10\";\n",0x11,1,pFVar7);
        fwrite("center = true;\n",0xf,1,pFVar7);
        fwrite("edge [dir = back];\n",0x13,1,pFVar7);
        fputc(10,pFVar7);
        fwrite("{\n",2,1,pFVar7);
        fwrite("  node [shape = plaintext];\n",0x1c,1,pFVar7);
        fwrite("  edge [style = invis];\n",0x18,1,pFVar7);
        fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,pFVar7);
        fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,pFVar7);
        if ((int)uVar5 < -1) {
          fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,pFVar7);
        }
        else {
          uVar13 = (ulong)(uVar5 + 2);
          do {
            uVar12 = (int)uVar13 - 1;
            uVar13 = (ulong)uVar12;
            fprintf(pFVar7,"  Level%d",uVar13);
            fwrite(" [label = ",10,1,pFVar7);
            fputc(0x22,pFVar7);
            fputc(0x22,pFVar7);
            fwrite("];\n",3,1,pFVar7);
          } while (0 < (int)uVar12);
          fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,pFVar7);
          uVar12 = uVar6;
          if (-2 < (int)uVar5) {
            do {
              fprintf(pFVar7,"  Level%d",(ulong)uVar12);
              if (uVar12 == 0) {
                fputc(0x3b,pFVar7);
              }
              else {
                fwrite(" ->",3,1,pFVar7);
              }
              bVar3 = 0 < (int)uVar12;
              uVar12 = uVar12 - 1;
            } while (bVar3);
          }
        }
        fputc(10,pFVar7);
        fputc(0x7d,pFVar7);
        fputc(10,pFVar7);
        fputc(10,pFVar7);
        fwrite("{\n",2,1,pFVar7);
        fwrite("  rank = same;\n",0xf,1,pFVar7);
        fwrite("  LevelTitle1;\n",0xf,1,pFVar7);
        fwrite("  title1 [shape=plaintext,\n",0x1b,1,pFVar7);
        fwrite("          fontsize=20,\n",0x17,1,pFVar7);
        fwrite("          fontname = \"Times-Roman\",\n",0x24,1,pFVar7);
        fwrite("          label=\"",0x11,1,pFVar7);
        fputs("AIG structure visualized by ABC",pFVar7);
        fwrite("\\n",2,1,pFVar7);
        fprintf(pFVar7,"Benchmark \\\"%s\\\". ","aig");
        pcVar9 = Extra_TimeStamp();
        fprintf(pFVar7,"Time was %s. ",pcVar9);
        fwrite("\"\n",2,1,pFVar7);
        fwrite("         ];\n",0xc,1,pFVar7);
        fputc(0x7d,pFVar7);
        fputc(10,pFVar7);
        fputc(10,pFVar7);
        fwrite("{\n",2,1,pFVar7);
        fwrite("  rank = same;\n",0xf,1,pFVar7);
        fwrite("  LevelTitle2;\n",0xf,1,pFVar7);
        fwrite("  title2 [shape=plaintext,\n",0x1b,1,pFVar7);
        fwrite("          fontsize=18,\n",0x17,1,pFVar7);
        fwrite("          fontname = \"Times-Roman\",\n",0x24,1,pFVar7);
        fwrite("          label=\"",0x11,1,pFVar7);
        fprintf(pFVar7,"The set contains %d logic nodes and spans %d levels.",
                (ulong)(uint)(pMan->nObjs[6] + pMan->nObjs[5]),uVar6);
        fwrite("\\n",2,1,pFVar7);
        fwrite("\"\n",2,1,pFVar7);
        fwrite("         ];\n",0xc,1,pFVar7);
        fputc(0x7d,pFVar7);
        fputc(10,pFVar7);
        fputc(10,pFVar7);
        fwrite("{\n",2,1,pFVar7);
        fwrite("  rank = same;\n",0xf,1,pFVar7);
        fprintf(pFVar7,"  Level%d;\n",uVar6);
        pVVar10 = pMan->vObjs;
        if (0 < pVVar10->nSize) {
          lVar8 = 0;
          do {
            puVar1 = (uint *)pVVar10->pArray[lVar8];
            if ((puVar1 != (uint *)0x0) && ((uVar6 = puVar1[2] & 0xf, uVar6 == 4 || (uVar6 == 2))))
            {
              if ((fHaig == 0) && (uVar13 = *(ulong *)(puVar1 + 0x12), uVar13 != 0)) {
                pcVar9 = "";
                if (uVar6 == 4) {
                  pcVar9 = "_in";
                }
                pcVar11 = "\'";
                if ((uVar13 & 1) == 0) {
                  pcVar11 = "";
                }
                fprintf(pFVar7,"  Node%d%s [label = \"%d%s(%d%s)\"",(ulong)*puVar1,pcVar9,
                        (ulong)*puVar1,pcVar9,(ulong)*(uint *)(uVar13 & 0xfffffffffffffffe),pcVar11)
                ;
              }
              else {
                pcVar9 = "";
                if (uVar6 == 4) {
                  pcVar9 = "_in";
                }
                fprintf(pFVar7,"  Node%d%s [label = \"%d%s\"",(ulong)*puVar1,pcVar9,(ulong)*puVar1,
                        pcVar9);
              }
              pcVar9 = "invtriangle";
              if ((puVar1[2] & 0xf) == 4) {
                pcVar9 = "box";
              }
              fprintf(pFVar7,", shape = %s",pcVar9);
              fwrite(", color = coral, fillcolor = coral",0x22,1,pFVar7);
              fwrite("];\n",3,1,pFVar7);
            }
            lVar8 = lVar8 + 1;
            pVVar10 = pMan->vObjs;
          } while (lVar8 < pVVar10->nSize);
        }
        fputc(0x7d,pFVar7);
        fputc(10,pFVar7);
        fputc(10,pFVar7);
        if (0 < (int)uVar5) {
          do {
            fwrite("{\n",2,1,pFVar7);
            fwrite("  rank = same;\n",0xf,1,pFVar7);
            fprintf(pFVar7,"  Level%d;\n",(ulong)uVar5);
            pVVar10 = pMan->vObjs;
            if (0 < pVVar10->nSize) {
              lVar8 = 0;
              do {
                puVar1 = (uint *)pVVar10->pArray[lVar8];
                if ((puVar1 != (uint *)0x0) && (puVar1[2] >> 0xb == uVar5)) {
                  if ((fHaig == 0) && (uVar13 = *(ulong *)(puVar1 + 0x12), uVar13 != 0)) {
                    pcVar9 = "\'";
                    if ((uVar13 & 1) == 0) {
                      pcVar9 = "";
                    }
                    fprintf(pFVar7,"  Node%d [label = \"%d(%d%s)\"",(ulong)*puVar1,(ulong)*puVar1,
                            (ulong)*(uint *)(uVar13 & 0xfffffffffffffffe),pcVar9);
                  }
                  else {
                    fprintf(pFVar7,"  Node%d [label = \"%d\"",(ulong)*puVar1);
                  }
                  fwrite(", shape = ellipse",0x11,1,pFVar7);
                  if ((vBold != (Vec_Ptr_t *)0x0) && ((puVar1[2] & 0x20) != 0)) {
                    fwrite(", style = filled",0x10,1,pFVar7);
                  }
                  fwrite("];\n",3,1,pFVar7);
                }
                lVar8 = lVar8 + 1;
                pVVar10 = pMan->vObjs;
              } while (lVar8 < pVVar10->nSize);
            }
            fputc(0x7d,pFVar7);
            fputc(10,pFVar7);
            fputc(10,pFVar7);
            bVar3 = 1 < (int)uVar5;
            uVar5 = uVar5 - 1;
          } while (bVar3);
        }
        fwrite("{\n",2,1,pFVar7);
        fwrite("  rank = same;\n",0xf,1,pFVar7);
        fprintf(pFVar7,"  Level%d;\n",0);
        if (0 < pMan->pConst1->nRefs) {
          fprintf(pFVar7,"  Node%d [label = \"Const1\"",(ulong)(uint)pMan->pConst1->Id);
          fwrite(", shape = ellipse",0x11,1,pFVar7);
          fwrite(", color = coral, fillcolor = coral",0x22,1,pFVar7);
          fwrite("];\n",3,1,pFVar7);
        }
        pVVar10 = pMan->vObjs;
        if (0 < pVVar10->nSize) {
          lVar8 = 0;
          do {
            puVar1 = (uint *)pVVar10->pArray[lVar8];
            if ((puVar1 != (uint *)0x0) && ((uVar6 = puVar1[2] & 0xf, uVar6 == 4 || (uVar6 == 1))))
            {
              if ((fHaig == 0) && (uVar13 = *(ulong *)(puVar1 + 0x12), uVar13 != 0)) {
                pcVar9 = "";
                if (uVar6 == 4) {
                  pcVar9 = "_out";
                }
                pcVar11 = "\'";
                if ((uVar13 & 1) == 0) {
                  pcVar11 = "";
                }
                fprintf(pFVar7,"  Node%d%s [label = \"%d%s(%d%s)\"",(ulong)*puVar1,pcVar9,
                        (ulong)*puVar1,pcVar9,(ulong)*(uint *)(uVar13 & 0xfffffffffffffffe),pcVar11)
                ;
              }
              else {
                pcVar9 = "";
                if (uVar6 == 4) {
                  pcVar9 = "_out";
                }
                fprintf(pFVar7,"  Node%d%s [label = \"%d%s\"",(ulong)*puVar1,pcVar9,(ulong)*puVar1,
                        pcVar9);
              }
              pcVar9 = "triangle";
              if ((puVar1[2] & 0xf) == 4) {
                pcVar9 = "box";
              }
              fprintf(pFVar7,", shape = %s",pcVar9);
              fwrite(", color = coral, fillcolor = coral",0x22,1,pFVar7);
              fwrite("];\n",3,1,pFVar7);
            }
            lVar8 = lVar8 + 1;
            pVVar10 = pMan->vObjs;
          } while (lVar8 < pVVar10->nSize);
        }
        fputc(0x7d,pFVar7);
        fputc(10,pFVar7);
        fputc(10,pFVar7);
        fwrite("title1 -> title2 [style = invis];\n",0x22,1,pFVar7);
        pVVar10 = pMan->vObjs;
        if (0 < pVVar10->nSize) {
          lVar8 = 0;
          do {
            puVar1 = (uint *)pVVar10->pArray[lVar8];
            if ((puVar1 != (uint *)0x0) && ((uVar6 = puVar1[2] & 0xf, uVar6 == 4 || (uVar6 == 2))))
            {
              pcVar9 = "_in";
              if (uVar6 != 4) {
                pcVar9 = "";
              }
              fprintf(pFVar7,"title2 -> Node%d%s [style = invis];\n",(ulong)*puVar1,pcVar9);
            }
            lVar8 = lVar8 + 1;
            pVVar10 = pMan->vObjs;
          } while (lVar8 < pVVar10->nSize);
        }
        pVVar10 = pMan->vObjs;
        if (0 < pVVar10->nSize) {
          lVar8 = 0;
          do {
            pcVar9 = "dotted";
            puVar1 = (uint *)pVVar10->pArray[lVar8];
            if ((puVar1 != (uint *)0x0) &&
               ((uVar6 = puVar1[2] & 0xf, 0xfffffffd < uVar6 - 7 ||
                ((uVar6 < 8 && ((0x94U >> uVar6 & 1) != 0)))))) {
              pcVar11 = "";
              if (uVar6 == 4) {
                pcVar11 = "_in";
              }
              uVar6 = 0;
              fprintf(pFVar7,"Node%d%s",(ulong)*puVar1,pcVar11);
              fwrite(" -> ",4,1,pFVar7);
              uVar13 = *(ulong *)(puVar1 + 4);
              if (uVar13 != 0) {
                uVar6 = *(uint *)(uVar13 & 0xfffffffffffffffe);
              }
              pcVar11 = "";
              if ((*(uint *)((uVar13 & 0xfffffffffffffffe) + 8) & 0xf) == 4) {
                pcVar11 = "_out";
              }
              fprintf(pFVar7,"Node%d%s",(ulong)uVar6,pcVar11);
              fwrite(" [",2,1,pFVar7);
              pcVar11 = pcVar9;
              if ((puVar1[4] & 1) == 0) {
                pcVar11 = "bold";
              }
              fprintf(pFVar7,"style = %s",pcVar11);
              fputc(0x5d,pFVar7);
              fwrite(";\n",2,1,pFVar7);
              if (0xfffffffd < (puVar1[2] & 0xf) - 7) {
                uVar6 = 0;
                fprintf(pFVar7,"Node%d",(ulong)*puVar1);
                fwrite(" -> ",4,1,pFVar7);
                uVar13 = *(ulong *)(puVar1 + 6);
                if (uVar13 != 0) {
                  uVar6 = *(uint *)(uVar13 & 0xfffffffffffffffe);
                }
                pcVar11 = "";
                if ((*(uint *)((uVar13 & 0xfffffffffffffffe) + 8) & 0xf) == 4) {
                  pcVar11 = "_out";
                }
                fprintf(pFVar7,"Node%d%s",(ulong)uVar6,pcVar11);
                fwrite(" [",2,1,pFVar7);
                if ((puVar1[6] & 1) == 0) {
                  pcVar9 = "bold";
                }
                fprintf(pFVar7,"style = %s",pcVar9);
                fputc(0x5d,pFVar7);
                fwrite(";\n",2,1,pFVar7);
                if (((fHaig != 0) && (puVar2 = *(uint **)(puVar1 + 0x12), puVar2 != (uint *)0x0)) &&
                   (puVar4 = puVar1, 0 < (int)puVar1[3])) {
                  for (; puVar2 != puVar1;
                      puVar2 = (uint *)(*(ulong *)(puVar2 + 0x12) & 0xfffffffffffffffe)) {
                    fprintf(pFVar7,"Node%d",(ulong)*puVar4);
                    fwrite(" -> ",4,1,pFVar7);
                    fprintf(pFVar7,"Node%d",(ulong)*puVar2);
                    pcVar9 = "dotted";
                    if ((puVar2[0x12] & 1) == 0) {
                      pcVar9 = "bold";
                    }
                    fprintf(pFVar7," [style = %s]",pcVar9);
                    fwrite(";\n",2,1,pFVar7);
                    puVar4 = puVar2;
                  }
                  fprintf(pFVar7,"Node%d",(ulong)*puVar4);
                  fwrite(" -> ",4,1,pFVar7);
                  fprintf(pFVar7,"Node%d",(ulong)*puVar1);
                  pcVar9 = "dotted";
                  if ((puVar4[0x12] & 1) == 0) {
                    pcVar9 = "bold";
                  }
                  fprintf(pFVar7," [style = %s]",pcVar9);
                  fwrite(";\n",2,1,pFVar7);
                }
              }
            }
            lVar8 = lVar8 + 1;
            pVVar10 = pMan->vObjs;
          } while (lVar8 < pVVar10->nSize);
        }
        fputc(0x7d,pFVar7);
        fputc(10,pFVar7);
        fputc(10,pFVar7);
        fclose(pFVar7);
        if ((vBold != (Vec_Ptr_t *)0x0) && (0 < vBold->nSize)) {
          lVar8 = 0;
          do {
            puVar1 = (uint *)((long)vBold->pArray[lVar8] + 8);
            *puVar1 = *puVar1 & 0xffffffdf;
            lVar8 = lVar8 + 1;
          } while (lVar8 < vBold->nSize);
        }
      }
    }
    else {
      fwrite("Cannot visualize AIG with more than 200 nodes.\n",0x2f,1,_stdout);
    }
    Abc_ShowFile(FileNameDot);
  }
  return;
}

Assistant:

void Ivy_ManShow( Ivy_Man_t * pMan, int fHaig, Vec_Ptr_t * vBold )
{
    extern void Abc_ShowFile( char * FileNameDot );
    static int Counter = 0;
    char FileNameDot[200];
    FILE * pFile;
    // create the file name
//    Ivy_ShowGetFileName( pMan->pName, FileNameDot );
    sprintf( FileNameDot, "temp%02d.dot", Counter++ );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    Ivy_WriteDotAig( pMan, FileNameDot, fHaig, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );
}